

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O2

vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
vkt::pipeline::anon_unknown_0::genFullQuadVertices
          (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
           *__return_storage_ptr__,int subpassCount)

{
  uint uVar1;
  value_type local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar1 = 0;
  if (subpassCount < 1) {
    subpassCount = 0;
  }
  for (; subpassCount != uVar1; uVar1 = uVar1 + 1) {
    local_58.position.m_data[0] = 0.0;
    local_58.position.m_data[1] = -1.0;
    local_58.position.m_data[2] = 0.0;
    local_58.position.m_data[3] = 1.0;
    tcu::Vector<float,_4>::Vector
              (&local_58.color,
               (Vector<float,_4> *)
               (pipeline::(anonymous_namespace)::COLOR_TABLE + ((uVar1 & 7) << 4)));
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (__return_storage_ptr__,&local_58);
    local_58.position.m_data[0] = 0.0;
    local_58.position.m_data[1] = 1.0;
    local_58.position.m_data[2] = 0.0;
    local_58.position.m_data[3] = 1.0;
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (__return_storage_ptr__,&local_58);
    local_58.position.m_data[0] = 1.0;
    local_58.position.m_data[1] = -1.0;
    local_58.position.m_data[2] = 0.0;
    local_58.position.m_data[3] = 1.0;
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (__return_storage_ptr__,&local_58);
    local_58.position.m_data._0_8_ = &DAT_3f8000003f800000;
    local_58.position.m_data[2] = 0.0;
    local_58.position.m_data[3] = 1.0;
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (__return_storage_ptr__,&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Vertex4RGBA> genFullQuadVertices (const int subpassCount)
{
	vector<Vertex4RGBA>	vectorData;
	for (int subpassNdx = 0; subpassNdx < subpassCount; ++subpassNdx)
	{
		Vertex4RGBA data =
		{
			Vec4(0.0f, -1.0f, 0.0f, 1.0f),
			COLOR_TABLE[subpassNdx % DE_LENGTH_OF_ARRAY(COLOR_TABLE)],
		};
		vectorData.push_back(data);
		data.position	= Vec4(0.0f,  1.0f, 0.0f, 1.0f);
		vectorData.push_back(data);
		data.position	= Vec4(1.0f, -1.0f, 0.0f, 1.0f);
		vectorData.push_back(data);
		data.position	= Vec4(1.0f,  1.0f, 0.0f, 1.0f);
		vectorData.push_back(data);
	}
	return vectorData;
}